

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O1

void formatRect(QDebug *debug,QRect r)

{
  QTextStream::operator<<((QTextStream *)debug->stream,(r.x2.m_i.m_i - r.x1.m_i) + 1);
  if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)debug->stream,' ');
  }
  QTextStream::operator<<((QTextStream *)debug->stream,'x');
  if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)debug->stream,' ');
  }
  QTextStream::operator<<((QTextStream *)debug->stream,(r.y2.m_i.m_i - r.y1.m_i) + 1);
  if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)debug->stream,' ');
  }
  Qt::forcesign((QTextStream *)debug->stream);
  QTextStream::operator<<((QTextStream *)debug->stream,r.x1.m_i.m_i);
  if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)debug->stream,' ');
  }
  QTextStream::operator<<((QTextStream *)debug->stream,r.y1.m_i.m_i);
  if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)debug->stream,' ');
  }
  Qt::noforcesign((QTextStream *)debug->stream);
  return;
}

Assistant:

static inline void formatRect(QDebug &debug, const QRect r)
{
    debug << r.width() << 'x' << r.height()
        << Qt::forcesign << r.x() << r.y() << Qt::noforcesign;
}